

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
* __thiscall
fmt::v10::
make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string,int>
          (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           *__return_storage_ptr__,v10 *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,int *args_1)

{
  size_t sVar1;
  int *args_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local;
  undefined1 local_c9;
  char *local_c8;
  size_t local_c0;
  undefined1 local_b3;
  undefined1 local_b2;
  undefined1 local_b1;
  bool formattable;
  bool formattable_pointer;
  v10 *pvStack_b0;
  bool formattable_char;
  char *local_a8 [5];
  v10 *local_80;
  undefined1 *local_78;
  basic_string_view<char> local_70;
  char **local_60;
  basic_string_view<char> local_58;
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_char_1;
  longlong local_38;
  size_t local_30;
  
  local_b1 = 1;
  local_b2 = 1;
  local_b3 = 1;
  local_78 = &local_c9;
  pvStack_b0 = this;
  local_80 = this;
  local_70 = detail::to_string_view<char,std::char_traits<char>,std::allocator<char>>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  local_c8 = local_70.data_;
  local_c0 = local_70.size_;
  local_58.data_ = local_70.data_;
  local_58.size_ = local_70.size_;
  local_60 = local_a8;
  local_a8[0] = basic_string_view<char>::data(&local_58);
  sVar1 = basic_string_view<char>::size(&local_58);
  local_38._0_4_ = *(undefined4 *)args;
  (__return_storage_ptr__->data_).args_[0].field_0.string.data = local_a8[0];
  (__return_storage_ptr__->data_).args_[0].field_0.string.size = sVar1;
  (__return_storage_ptr__->data_).args_[1].field_0.long_long_value = local_38;
  (__return_storage_ptr__->data_).args_[1].field_0.string.size = local_30;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(T&... args)
    -> format_arg_store<Context, remove_cvref_t<T>...> {
  return {args...};
}